

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O0

void test_convert<long,double>(uint length,long value)

{
  bool bVar1;
  long *__p;
  double *__p_00;
  element_type *pSrc;
  element_type *pDst;
  undefined8 *puVar2;
  uint local_2ec;
  uint i;
  double *u;
  long *t;
  undefined1 local_2c8 [8];
  shared_ptr<double> pu;
  shared_ptr<long> pt;
  long value_local;
  long lStack_298;
  uint length_local;
  long lStack_290;
  uint local_284;
  element_type *local_280;
  long local_278;
  int local_26c;
  element_type *local_268;
  undefined1 *local_260;
  long local_258;
  long lStack_250;
  long local_248;
  long lStack_240;
  long local_238;
  long lStack_230;
  long local_228;
  long lStack_220;
  long local_218;
  long lStack_210;
  long local_208;
  long lStack_200;
  long local_1f8;
  long lStack_1f0;
  long local_1e8;
  long lStack_1e0;
  element_type *local_1d0;
  long local_1c8;
  long lStack_1c0;
  element_type *local_1b0;
  long local_1a8;
  long lStack_1a0;
  element_type *local_190;
  long local_188;
  long lStack_180;
  element_type *local_170;
  long local_168;
  long lStack_160;
  element_type *local_150;
  long local_148;
  long lStack_140;
  element_type *local_130;
  long local_128;
  long lStack_120;
  element_type *local_110;
  long local_108;
  long lStack_100;
  element_type *local_f0;
  long local_e8;
  long lStack_e0;
  element_type *local_d0;
  long local_c8;
  long lStack_c0;
  element_type *local_b0;
  long local_a8;
  long lStack_a0;
  element_type *local_90;
  long local_88;
  long lStack_80;
  element_type *local_70;
  long local_68;
  long lStack_60;
  element_type *local_50;
  long local_48;
  long lStack_40;
  element_type *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  long local_18;
  long local_10;
  
  __p = nosimd::common::malloc<long>(length);
  std::shared_ptr<long>::shared_ptr<long,void(*)(long*),void>
            ((shared_ptr<long> *)
             &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p,
             nosimd::common::free<long>);
  __p_00 = nosimd::common::malloc<double>(length);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)local_2c8,__p_00,nosimd::common::free<double>);
  pSrc = std::__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2> *)
                    &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pDst = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)local_2c8);
  local_260 = (undefined1 *)&stack0xfffffffffffffd68;
  local_268 = pSrc;
  for (local_26c = (int)length >> 1; 3 < local_26c; local_26c = local_26c + -4) {
    local_170 = local_268;
    local_90 = local_268;
    *local_268 = value;
    local_268[1] = value;
    local_190 = local_268 + 2;
    *local_190 = value;
    local_268[3] = value;
    local_1b0 = local_268 + 4;
    *local_1b0 = value;
    local_268[5] = value;
    local_1d0 = local_268 + 6;
    *local_1d0 = value;
    local_268[7] = value;
    local_268 = local_268 + 8;
    local_258 = value;
    lStack_250 = value;
    local_248 = value;
    lStack_240 = value;
    local_238 = value;
    lStack_230 = value;
    local_228 = value;
    lStack_220 = value;
    local_1e8 = value;
    lStack_1e0 = value;
    local_1c8 = value;
    lStack_1c0 = value;
    local_1a8 = value;
    lStack_1a0 = value;
    local_188 = value;
    lStack_180 = value;
    local_a8 = value;
    lStack_a0 = value;
    local_88 = value;
    lStack_80 = value;
    local_70 = local_190;
    local_68 = value;
    lStack_60 = value;
    local_50 = local_1b0;
    local_48 = value;
    lStack_40 = value;
    local_38 = local_1d0;
  }
  if (1 < local_26c) {
    local_130 = local_268;
    local_d0 = local_268;
    *local_268 = value;
    local_268[1] = value;
    local_150 = local_268 + 2;
    *local_150 = value;
    local_268[3] = value;
    local_26c = local_26c + -2;
    local_268 = local_268 + 4;
    local_218 = value;
    lStack_210 = value;
    local_208 = value;
    lStack_200 = value;
    local_168 = value;
    lStack_160 = value;
    local_148 = value;
    lStack_140 = value;
    local_e8 = value;
    lStack_e0 = value;
    local_c8 = value;
    lStack_c0 = value;
    local_b0 = local_150;
  }
  if (local_26c != 0) {
    local_110 = local_268;
    local_f0 = local_268;
    *local_268 = value;
    local_268[1] = value;
    local_1f8 = value;
    lStack_1f0 = value;
    local_128 = value;
    lStack_120 = value;
    local_108 = value;
    lStack_100 = value;
  }
  if (length != 0) {
    pSrc[(int)(length - 1)] = value;
  }
  lStack_298 = value;
  lStack_290 = value;
  local_284 = length;
  local_280 = pSrc;
  local_278 = value;
  local_30 = value;
  local_28 = value;
  lStack_20 = value;
  local_18 = value;
  local_10 = value;
  sse::common::convert<long,double>(pSrc,pDst,length);
  local_2ec = 0;
  while( true ) {
    if (length <= local_2ec) {
      std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)local_2c8);
      std::shared_ptr<long>::~shared_ptr
                ((shared_ptr<long> *)
                 &pu.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return;
    }
    bVar1 = anon_unknown.dwarf_942e::equal<double>(pDst[local_2ec],(double)value);
    if (!bVar1) break;
    local_2ec = local_2ec + 1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = long, _U = double]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}